

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptor_haar_unroll_2_8_False(integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  int iVar2;
  float *pfVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  int iVar28;
  float *data;
  ulong uVar29;
  int iVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  uint uVar44;
  int iVar45;
  int iVar46;
  float *pfVar47;
  int iVar48;
  long lVar49;
  long lVar50;
  int iVar51;
  int iVar52;
  ulong uVar53;
  int iVar54;
  float *pfVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  long lVar60;
  int k_count;
  int scale;
  long lVar61;
  int iVar62;
  long lVar63;
  long lVar64;
  float *pfVar65;
  byte bVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar105;
  undefined1 auVar106 [64];
  undefined1 auVar107 [12];
  undefined1 in_ZMM8 [64];
  undefined1 in_ZMM10 [64];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar110;
  undefined1 auVar111 [64];
  int data_width;
  float local_f8;
  
  auVar75._8_4_ = 0x3effffff;
  auVar75._0_8_ = 0x3effffff3effffff;
  auVar75._12_4_ = 0x3effffff;
  auVar106 = ZEXT1664(auVar75);
  auVar74._8_4_ = 0x80000000;
  auVar74._0_8_ = 0x8000000080000000;
  auVar74._12_4_ = 0x80000000;
  fVar81 = ipoint->scale;
  auVar111 = ZEXT464((uint)fVar81);
  auVar67 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)fVar81),auVar74,0xf8);
  auVar67 = ZEXT416((uint)(fVar81 + auVar67._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  fVar79 = -0.08 / (fVar81 * fVar81);
  scale = (int)auVar67._0_4_;
  auVar68._0_4_ = (int)auVar67._0_4_;
  auVar68._4_4_ = (int)auVar67._4_4_;
  auVar68._8_4_ = (int)auVar67._8_4_;
  auVar68._12_4_ = (int)auVar67._12_4_;
  auVar67 = vcvtdq2ps_avx(auVar68);
  auVar68 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)ipoint->x),auVar74,0xf8);
  auVar68 = ZEXT416((uint)(ipoint->x + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar70._0_8_ = (double)auVar68._0_4_;
  auVar70._8_8_ = auVar68._8_8_;
  auVar73._0_8_ = (double)fVar81;
  auVar73._8_8_ = 0;
  auVar68 = vfmadd231sd_fma(auVar70,auVar73,ZEXT816(0x3fe0000000000000));
  auVar72._0_4_ = (float)auVar68._0_8_;
  auVar72._4_12_ = auVar68._4_12_;
  auVar68 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)ipoint->y),auVar74,0xf8);
  fVar5 = auVar72._0_4_ - auVar67._0_4_;
  auVar68 = ZEXT416((uint)(ipoint->y + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar70 = ZEXT416((uint)fVar5);
  auVar69._0_8_ = (double)auVar68._0_4_;
  auVar69._8_8_ = auVar68._8_8_;
  auVar68 = vfmadd231sd_fma(auVar69,auVar73,ZEXT816(0x3fe0000000000000));
  auVar71._0_4_ = (float)auVar68._0_8_;
  auVar71._4_12_ = auVar68._4_12_;
  fVar110 = auVar71._0_4_ - auVar67._0_4_;
  auVar67 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar81),auVar72);
  auVar68 = vpternlogd_avx512vl(auVar75,auVar67,auVar74,0xf8);
  auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar68._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  auVar68 = ZEXT416((uint)fVar81);
  if (scale < (int)auVar67._0_4_) {
    auVar76._8_4_ = 0x3effffff;
    auVar76._0_8_ = 0x3effffff3effffff;
    auVar76._12_4_ = 0x3effffff;
    auVar77._8_4_ = 0x80000000;
    auVar77._0_8_ = 0x8000000080000000;
    auVar77._12_4_ = 0x80000000;
    auVar67 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar68,auVar71);
    auVar69 = vpternlogd_avx512vl(auVar77,auVar67,auVar76,0xea);
    auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar69._0_4_));
    auVar67 = vroundss_avx(auVar67,auVar67,0xb);
    if (scale < (int)auVar67._0_4_) {
      auVar67 = vfmadd231ss_fma(auVar72,auVar68,ZEXT416(0x41300000));
      auVar78._8_4_ = 0x80000000;
      auVar78._0_8_ = 0x8000000080000000;
      auVar78._12_4_ = 0x80000000;
      auVar69 = vpternlogd_avx512vl(auVar78,auVar67,auVar76,0xea);
      auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar69._0_4_));
      auVar67 = vroundss_avx(auVar67,auVar67,0xb);
      if ((int)auVar67._0_4_ + scale <= iimage->width) {
        auVar67 = vfmadd231ss_fma(auVar71,auVar68,ZEXT416(0x41300000));
        auVar13._8_4_ = 0x80000000;
        auVar13._0_8_ = 0x8000000080000000;
        auVar13._12_4_ = 0x80000000;
        auVar69 = vpternlogd_avx512vl(auVar76,auVar67,auVar13,0xf8);
        auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar69._0_4_));
        auVar67 = vroundss_avx(auVar67,auVar67,0xb);
        if ((int)auVar67._0_4_ + scale <= iimage->height) {
          iVar2 = iimage->data_width;
          pfVar65 = iimage->data;
          fVar5 = fVar5 + 0.5;
          iVar34 = scale * 2;
          pfVar47 = haarResponseX + 0x1f;
          pfVar55 = haarResponseY + 0x1f;
          uVar24 = 0xfffffff4;
          do {
            auVar67._0_4_ = (float)(int)uVar24;
            auVar67._4_12_ = in_ZMM8._4_12_;
            auVar100._0_4_ = (float)(int)(uVar24 | 1);
            auVar100._4_12_ = in_ZMM8._4_12_;
            auVar67 = vfmadd213ss_fma(auVar67,auVar68,ZEXT416((uint)(fVar110 + 0.5)));
            auVar70 = vfmadd213ss_fma(auVar100,auVar68,ZEXT416((uint)(fVar110 + 0.5)));
            iVar17 = (int)auVar67._0_4_;
            iVar20 = (int)auVar70._0_4_;
            iVar18 = (iVar17 + -1) * iVar2;
            iVar19 = (iVar17 + -1 + scale) * iVar2;
            iVar21 = (iVar17 + -1 + iVar34) * iVar2;
            iVar17 = (iVar20 + -1 + iVar34) * iVar2;
            lVar64 = 0;
            iVar23 = (iVar20 + -1) * iVar2;
            iVar20 = (iVar20 + -1 + scale) * iVar2;
            do {
              iVar27 = (int)lVar64;
              auVar93._0_4_ = (float)(iVar27 + -0xc);
              auVar93._4_12_ = auVar106._4_12_;
              auVar67 = vfmadd213ss_fma(auVar93,auVar68,ZEXT416((uint)fVar5));
              iVar42 = (int)auVar67._0_4_;
              auVar94._0_4_ = (float)(iVar27 + -0xb);
              auVar94._4_12_ = auVar106._4_12_;
              auVar67 = vfmadd213ss_fma(auVar94,auVar68,ZEXT416((uint)fVar5));
              iVar43 = iVar42 + -1 + scale;
              iVar51 = iVar42 + -1 + iVar34;
              iVar28 = (int)auVar67._0_4_;
              fVar81 = pfVar65[iVar21 + -1 + iVar42];
              fVar80 = pfVar65[iVar18 + iVar51];
              auVar95._0_4_ = (float)(iVar27 + -10);
              auVar107 = in_ZMM10._4_12_;
              auVar95._4_12_ = auVar107;
              auVar70 = ZEXT416((uint)fVar5);
              auVar67 = vfmadd213ss_fma(auVar95,auVar68,auVar70);
              iVar30 = (int)auVar67._0_4_;
              auVar96._0_4_ = (float)(iVar27 + -9);
              auVar96._4_12_ = auVar107;
              auVar67 = vfmadd213ss_fma(auVar96,auVar68,auVar70);
              iVar32 = (int)auVar67._0_4_;
              auVar97._0_4_ = (float)(iVar27 + -8);
              auVar97._4_12_ = auVar107;
              auVar67 = vfmadd213ss_fma(auVar97,auVar68,auVar70);
              iVar54 = (int)auVar67._0_4_;
              auVar104._0_4_ = (float)(iVar27 + -7);
              auVar104._4_12_ = auVar107;
              auVar101._0_4_ = (float)(iVar27 + -6);
              auVar101._4_12_ = auVar107;
              auVar98._0_4_ = (float)(iVar27 + -5);
              auVar98._4_12_ = auVar107;
              auVar67 = vfmadd213ss_fma(auVar104,auVar68,auVar70);
              auVar70 = vfmadd213ss_fma(auVar101,auVar68,ZEXT416((uint)fVar5));
              auVar69 = vfmadd213ss_fma(auVar98,auVar68,ZEXT416((uint)fVar5));
              auVar73 = SUB6416(ZEXT464(0x40000000),0);
              auVar71 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar18 + iVar43] -
                                                      pfVar65[iVar21 + iVar43])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar21 + iVar51] -
                                                      pfVar65[iVar18 + -1 + iVar42])));
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar19 + -1 + iVar42] -
                                                      pfVar65[iVar19 + iVar51])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar21 + iVar51] -
                                                      pfVar65[iVar18 + -1 + iVar42])));
              pfVar47[lVar64 + -0x1f] = (fVar81 - fVar80) + auVar71._0_4_;
              pfVar55[lVar64 + -0x1f] = auVar72._0_4_ - (fVar81 - fVar80);
              iVar59 = iVar28 + -1 + scale;
              iVar45 = iVar28 + -1 + iVar34;
              fVar81 = pfVar65[iVar21 + -1 + iVar28];
              fVar80 = pfVar65[iVar18 + iVar45];
              iVar58 = iVar30 + -1 + scale;
              iVar48 = iVar30 + -1 + iVar34;
              auVar71 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar19 + -1 + iVar28] -
                                                      pfVar65[iVar19 + iVar45])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar21 + iVar45] -
                                                      pfVar65[iVar18 + -1 + iVar28])));
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar18 + iVar59] -
                                                      pfVar65[iVar21 + iVar59])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar21 + iVar45] -
                                                      pfVar65[iVar18 + -1 + iVar28])));
              pfVar47[lVar64 + -0x1e] = (fVar81 - fVar80) + auVar72._0_4_;
              pfVar55[lVar64 + -0x1e] = auVar71._0_4_ - (fVar81 - fVar80);
              fVar81 = pfVar65[iVar21 + -1 + iVar30];
              fVar80 = pfVar65[iVar18 + iVar48];
              iVar37 = iVar32 + -1 + scale;
              iVar57 = iVar32 + -1 + iVar34;
              auVar71 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar19 + -1 + iVar30] -
                                                      pfVar65[iVar19 + iVar48])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar21 + iVar48] -
                                                      pfVar65[iVar18 + -1 + iVar30])));
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar18 + iVar58] -
                                                      pfVar65[iVar21 + iVar58])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar21 + iVar48] -
                                                      pfVar65[iVar18 + -1 + iVar30])));
              pfVar47[lVar64 + -0x1d] = (fVar81 - fVar80) + auVar72._0_4_;
              pfVar55[lVar64 + -0x1d] = auVar71._0_4_ - (fVar81 - fVar80);
              fVar81 = pfVar65[iVar21 + -1 + iVar32];
              fVar80 = pfVar65[iVar18 + iVar57];
              iVar38 = iVar54 + -1 + scale;
              auVar71 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar18 + iVar37] -
                                                      pfVar65[iVar21 + iVar37])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar21 + iVar57] -
                                                      pfVar65[iVar18 + -1 + iVar32])));
              auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar19 + -1 + iVar32] -
                                                      pfVar65[iVar19 + iVar57])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar21 + iVar57] -
                                                      pfVar65[iVar18 + -1 + iVar32])));
              pfVar47[lVar64 + -0x1c] = (fVar81 - fVar80) + auVar71._0_4_;
              pfVar55[lVar64 + -0x1c] = auVar72._0_4_ - (fVar81 - fVar80);
              fVar81 = pfVar65[iVar21 + -1 + iVar54];
              iVar22 = iVar54 + -1 + iVar34;
              fVar80 = pfVar65[iVar18 + iVar22];
              iVar56 = (int)auVar67._0_4_;
              iVar39 = iVar56 + -1 + scale;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar18 + iVar38] -
                                                      pfVar65[iVar21 + iVar38])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar21 + iVar22] -
                                                      pfVar65[iVar18 + -1 + iVar54])));
              auVar71 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar19 + -1 + iVar54] -
                                                      pfVar65[iVar19 + iVar22])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar21 + iVar22] -
                                                      pfVar65[iVar18 + -1 + iVar54])));
              pfVar47[lVar64 + -0x1b] = (fVar81 - fVar80) + auVar67._0_4_;
              pfVar55[lVar64 + -0x1b] = auVar71._0_4_ - (fVar81 - fVar80);
              fVar81 = pfVar65[iVar21 + -1 + iVar56];
              iVar36 = iVar56 + -1 + iVar34;
              iVar46 = (int)auVar70._0_4_;
              fVar84 = pfVar65[iVar21 + iVar36] - pfVar65[iVar18 + -1 + iVar56];
              in_ZMM8 = ZEXT464((uint)fVar84);
              fVar80 = pfVar65[iVar18 + iVar36];
              iVar40 = iVar46 + -1 + scale;
              iVar35 = iVar46 + -1 + iVar34;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar18 + iVar39] -
                                                      pfVar65[iVar21 + iVar39])),auVar73,
                                        ZEXT416((uint)fVar84));
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar19 + -1 + iVar56] -
                                                      pfVar65[iVar19 + iVar36])),auVar73,
                                        ZEXT416((uint)fVar84));
              pfVar47[lVar64 + -0x1a] = (fVar81 - fVar80) + auVar67._0_4_;
              pfVar55[lVar64 + -0x1a] = auVar70._0_4_ - (fVar81 - fVar80);
              fVar81 = pfVar65[iVar21 + -1 + iVar46];
              iVar62 = (int)auVar69._0_4_;
              fVar84 = pfVar65[iVar21 + iVar35] - pfVar65[iVar18 + -1 + iVar46];
              auVar106 = ZEXT464((uint)fVar84);
              fVar80 = pfVar65[iVar18 + iVar35];
              iVar41 = iVar62 + -1 + scale;
              iVar52 = iVar62 + -1 + iVar34;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar18 + iVar40] -
                                                      pfVar65[iVar21 + iVar40])),auVar73,
                                        ZEXT416((uint)fVar84));
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar19 + -1 + iVar46] -
                                                      pfVar65[iVar19 + iVar35])),auVar73,
                                        ZEXT416((uint)fVar84));
              pfVar47[lVar64 + -0x19] = (fVar81 - fVar80) + auVar67._0_4_;
              pfVar55[lVar64 + -0x19] = auVar70._0_4_ - (fVar81 - fVar80);
              fVar81 = pfVar65[iVar21 + -1 + iVar62];
              fVar80 = pfVar65[iVar18 + iVar52];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar18 + iVar41] -
                                                      pfVar65[iVar21 + iVar41])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar21 + iVar52] -
                                                      pfVar65[iVar18 + -1 + iVar62])));
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar19 + -1 + iVar62] -
                                                      pfVar65[iVar19 + iVar52])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar21 + iVar52] -
                                                      pfVar65[iVar18 + -1 + iVar62])));
              pfVar47[lVar64 + -0x18] = (fVar81 - fVar80) + auVar67._0_4_;
              pfVar55[lVar64 + -0x18] = auVar70._0_4_ - (fVar81 - fVar80);
              fVar81 = pfVar65[iVar17 + -1 + iVar42];
              fVar80 = pfVar65[iVar23 + iVar51];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar23 + iVar43] -
                                                      pfVar65[iVar43 + iVar17])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar51 + iVar17] -
                                                      pfVar65[iVar23 + -1 + iVar42])));
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar20 + -1 + iVar42] -
                                                      pfVar65[iVar20 + iVar51])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar51 + iVar17] -
                                                      pfVar65[iVar23 + -1 + iVar42])));
              pfVar47[lVar64 + -7] = (fVar81 - fVar80) + auVar67._0_4_;
              pfVar55[lVar64 + -7] = auVar70._0_4_ - (fVar81 - fVar80);
              fVar81 = pfVar65[iVar17 + -1 + iVar28];
              fVar80 = pfVar65[iVar23 + iVar45];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar23 + iVar59] -
                                                      pfVar65[iVar59 + iVar17])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar45 + iVar17] -
                                                      pfVar65[iVar23 + -1 + iVar28])));
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar20 + -1 + iVar28] -
                                                      pfVar65[iVar20 + iVar45])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar45 + iVar17] -
                                                      pfVar65[iVar23 + -1 + iVar28])));
              pfVar47[lVar64 + -6] = (fVar81 - fVar80) + auVar67._0_4_;
              pfVar55[lVar64 + -6] = auVar70._0_4_ - (fVar81 - fVar80);
              fVar81 = pfVar65[iVar17 + -1 + iVar30];
              fVar80 = pfVar65[iVar23 + iVar48];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar23 + iVar58] -
                                                      pfVar65[iVar58 + iVar17])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar48 + iVar17] -
                                                      pfVar65[iVar23 + -1 + iVar30])));
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar20 + -1 + iVar30] -
                                                      pfVar65[iVar20 + iVar48])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar48 + iVar17] -
                                                      pfVar65[iVar23 + -1 + iVar30])));
              pfVar47[lVar64 + -5] = (fVar81 - fVar80) + auVar67._0_4_;
              pfVar55[lVar64 + -5] = auVar70._0_4_ - (fVar81 - fVar80);
              fVar81 = pfVar65[iVar17 + -1 + iVar32];
              fVar80 = pfVar65[iVar23 + iVar57];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar23 + iVar37] -
                                                      pfVar65[iVar37 + iVar17])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar57 + iVar17] -
                                                      pfVar65[iVar23 + -1 + iVar32])));
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar20 + -1 + iVar32] -
                                                      pfVar65[iVar20 + iVar57])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar57 + iVar17] -
                                                      pfVar65[iVar23 + -1 + iVar32])));
              pfVar47[lVar64 + -4] = (fVar81 - fVar80) + auVar67._0_4_;
              pfVar55[lVar64 + -4] = auVar70._0_4_ - (fVar81 - fVar80);
              fVar81 = pfVar65[iVar17 + -1 + iVar54];
              fVar80 = pfVar65[iVar23 + iVar22];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar20 + -1 + iVar54] -
                                                      pfVar65[iVar20 + iVar22])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar22 + iVar17] -
                                                      pfVar65[iVar23 + -1 + iVar54])));
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar23 + iVar38] -
                                                      pfVar65[iVar38 + iVar17])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar22 + iVar17] -
                                                      pfVar65[iVar23 + -1 + iVar54])));
              pfVar47[lVar64 + -3] = (fVar81 - fVar80) + auVar70._0_4_;
              pfVar55[lVar64 + -3] = auVar67._0_4_ - (fVar81 - fVar80);
              fVar81 = pfVar65[iVar17 + -1 + iVar56];
              fVar80 = pfVar65[iVar23 + iVar36];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar23 + iVar39] -
                                                      pfVar65[iVar39 + iVar17])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar36 + iVar17] -
                                                      pfVar65[iVar23 + -1 + iVar56])));
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar20 + -1 + iVar56] -
                                                      pfVar65[iVar20 + iVar36])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar36 + iVar17] -
                                                      pfVar65[iVar23 + -1 + iVar56])));
              pfVar47[lVar64 + -2] = (fVar81 - fVar80) + auVar67._0_4_;
              pfVar55[lVar64 + -2] = auVar70._0_4_ - (fVar81 - fVar80);
              fVar81 = pfVar65[iVar17 + -1 + iVar46];
              fVar80 = pfVar65[iVar23 + iVar35];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar20 + -1 + iVar46] -
                                                      pfVar65[iVar20 + iVar35])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar35 + iVar17] -
                                                      pfVar65[iVar23 + -1 + iVar46])));
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar23 + iVar40] -
                                                      pfVar65[iVar40 + iVar17])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar35 + iVar17] -
                                                      pfVar65[iVar23 + -1 + iVar46])));
              pfVar47[lVar64 + -1] = (fVar81 - fVar80) + auVar70._0_4_;
              pfVar55[lVar64 + -1] = auVar67._0_4_ - (fVar81 - fVar80);
              fVar81 = pfVar65[iVar17 + -1 + iVar62];
              fVar80 = pfVar65[iVar23 + iVar52];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar23 + iVar41] -
                                                      pfVar65[iVar41 + iVar17])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar52 + iVar17] -
                                                      pfVar65[iVar23 + -1 + iVar62])));
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar65[iVar20 + -1 + iVar62] -
                                                      pfVar65[iVar20 + iVar52])),auVar73,
                                        ZEXT416((uint)(pfVar65[iVar52 + iVar17] -
                                                      pfVar65[iVar23 + -1 + iVar62])));
              pfVar47[lVar64] = (fVar81 - fVar80) + auVar67._0_4_;
              pfVar55[lVar64] = auVar70._0_4_ - (fVar81 - fVar80);
              lVar64 = lVar64 + 8;
            } while (iVar27 + -0xc < 4);
            pfVar55 = pfVar55 + 0x30;
            pfVar47 = pfVar47 + 0x30;
            bVar4 = (int)uVar24 < 10;
            uVar24 = uVar24 + 2;
          } while (bVar4);
          goto LAB_001c0efc;
        }
      }
    }
  }
  iVar2 = scale * 2;
  lVar64 = 0;
  uVar24 = 0xfffffff4;
  do {
    auVar82._0_4_ = (float)(int)uVar24;
    auVar82._4_12_ = in_ZMM8._4_12_;
    auVar85._0_4_ = (float)(int)(uVar24 | 1);
    auVar85._4_12_ = in_ZMM8._4_12_;
    auVar67 = vfmadd213ss_fma(auVar82,auVar111._0_16_,ZEXT416((uint)fVar110));
    auVar69 = vfmadd213ss_fma(auVar85,auVar111._0_16_,ZEXT416((uint)fVar110));
    fVar80 = auVar67._0_4_;
    fVar84 = auVar69._0_4_;
    iVar30 = (int)((double)((ulong)(0.0 <= fVar80) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar80) * -0x4020000000000000) + (double)fVar80);
    iVar17 = iVar2 + iVar30;
    iVar18 = iVar30 + -1;
    iVar19 = iVar30 + -1 + scale;
    iVar20 = iVar2 + -1 + iVar30;
    iVar32 = (int)((double)((ulong)(0.0 <= fVar84) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar84) * -0x4020000000000000) + (double)fVar84);
    iVar23 = iVar32 + -1 + scale;
    iVar21 = iVar2 + iVar32;
    iVar27 = iVar32 + -1;
    iVar28 = iVar2 + -1 + iVar32;
    pfVar47 = haarResponseX;
    pfVar65 = haarResponseY;
    lVar63 = lVar64;
    iVar34 = -0xc;
    do {
      auVar83._0_4_ = (float)iVar34;
      auVar107 = in_ZMM8._4_12_;
      auVar83._4_12_ = auVar107;
      auVar72 = auVar111._0_16_;
      auVar67 = vfmadd213ss_fma(auVar83,auVar72,auVar70);
      auVar103._0_4_ = (float)(iVar34 + 1);
      auVar103._4_12_ = auVar107;
      auVar91._0_4_ = (float)(iVar34 + 2);
      auVar91._4_12_ = auVar107;
      auVar88._0_4_ = (float)(iVar34 + 3);
      auVar88._4_12_ = auVar107;
      auVar69 = vfmadd213ss_fma(auVar91,auVar72,auVar70);
      auVar71 = vfmadd213ss_fma(auVar103,auVar72,auVar70);
      fVar102 = auVar71._0_4_;
      auVar71 = vfmadd213ss_fma(auVar88,auVar72,auVar70);
      fVar80 = auVar67._0_4_;
      fVar90 = auVar69._0_4_;
      fVar84 = auVar71._0_4_;
      iVar54 = (int)((double)((ulong)(0.0 <= fVar80) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar80) * -0x4020000000000000) + (double)fVar80);
      if (((iVar30 < 1) || (iVar54 < 1)) || (iimage->height < iVar17)) {
LAB_001bfa7a:
        haarXY(iimage,iVar30,iVar54,scale,(float *)((long)pfVar47 + lVar63),
               (float *)((long)pfVar65 + lVar63));
        iVar22 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar22 = iimage->width;
        iVar36 = iVar2 + iVar54;
        if (iVar22 < iVar36) goto LAB_001bfa7a;
        iVar37 = iimage->data_width;
        pfVar55 = iimage->data;
        iVar40 = iVar54 + -1 + scale;
        iVar39 = iVar37 * iVar18;
        iVar38 = iVar37 * iVar20;
        fVar80 = pfVar55[iVar38 + -1 + iVar54];
        fVar87 = pfVar55[iVar39 + -1 + iVar36];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar55[iVar39 + iVar40] - pfVar55[iVar38 + iVar40]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar55[iVar38 + -1 + iVar36] -
                                                pfVar55[iVar39 + -1 + iVar54])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar55[iVar37 * iVar19 + -1 + iVar54] -
                                                pfVar55[iVar37 * iVar19 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar55[iVar38 + -1 + iVar36] -
                                                pfVar55[iVar39 + -1 + iVar54])));
        *(float *)((long)pfVar47 + lVar63) = (fVar80 - fVar87) + auVar67._0_4_;
        *(float *)((long)pfVar65 + lVar63) = auVar69._0_4_ - (fVar80 - fVar87);
      }
      pfVar55 = (float *)((long)pfVar47 + lVar63 + 4);
      pfVar1 = (float *)((long)pfVar65 + lVar63 + 4);
      iVar36 = (int)((double)((ulong)(0.0 <= fVar102) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar102) * -0x4020000000000000) + (double)fVar102);
      if (((iVar30 < 1) || (iVar36 < 1)) ||
         ((iimage->height < iVar17 || (iVar37 = iVar2 + iVar36, iVar22 < iVar37)))) {
        haarXY(iimage,iVar30,iVar36,scale,pfVar55,pfVar1);
        iVar22 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar38 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar40 = iVar36 + -1 + scale;
        iVar39 = iVar38 * iVar18;
        iVar41 = iVar38 * iVar20;
        fVar80 = pfVar3[iVar41 + -1 + iVar36];
        fVar102 = pfVar3[iVar39 + -1 + iVar37];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar39 + iVar40] - pfVar3[iVar41 + iVar40]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar41 + -1 + iVar37] -
                                                pfVar3[iVar39 + -1 + iVar36])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 * iVar19 + -1 + iVar36] -
                                                pfVar3[iVar38 * iVar19 + -1 + iVar37])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar41 + -1 + iVar37] -
                                                pfVar3[iVar39 + -1 + iVar36])));
        *pfVar55 = (fVar80 - fVar102) + auVar67._0_4_;
        *pfVar1 = auVar69._0_4_ - (fVar80 - fVar102);
      }
      pfVar55 = (float *)((long)pfVar47 + lVar63 + 8);
      pfVar1 = (float *)((long)pfVar65 + lVar63 + 8);
      iVar37 = (int)((double)((ulong)(0.0 <= fVar90) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar90) * -0x4020000000000000) + (double)fVar90);
      if (((iVar30 < 1) || (iVar37 < 1)) ||
         ((iimage->height < iVar17 || (iVar38 = iVar2 + iVar37, iVar22 < iVar38)))) {
        haarXY(iimage,iVar30,iVar37,scale,pfVar55,pfVar1);
        iVar22 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar39 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar41 = iVar37 + -1 + scale;
        iVar40 = iVar39 * iVar18;
        iVar42 = iVar39 * iVar20;
        fVar80 = pfVar3[iVar42 + -1 + iVar37];
        fVar90 = pfVar3[iVar40 + -1 + iVar38];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar40 + iVar41] - pfVar3[iVar42 + iVar41]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar42 + -1 + iVar38] -
                                                pfVar3[iVar40 + -1 + iVar37])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar39 * iVar19 + -1 + iVar37] -
                                                pfVar3[iVar39 * iVar19 + -1 + iVar38])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar42 + -1 + iVar38] -
                                                pfVar3[iVar40 + -1 + iVar37])));
        *pfVar55 = (fVar80 - fVar90) + auVar67._0_4_;
        *pfVar1 = auVar69._0_4_ - (fVar80 - fVar90);
      }
      pfVar55 = (float *)((long)pfVar47 + lVar63 + 0xc);
      pfVar1 = (float *)((long)pfVar65 + lVar63 + 0xc);
      iVar38 = (int)((double)((ulong)(0.0 <= fVar84) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar84) * -0x4020000000000000) + (double)fVar84);
      if ((((iVar30 < 1) || (iVar38 < 1)) || (iimage->height < iVar17)) ||
         (iVar39 = iVar2 + iVar38, iVar22 < iVar39)) {
        haarXY(iimage,iVar30,iVar38,scale,pfVar55,pfVar1);
        iVar22 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar40 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar42 = iVar38 + -1 + scale;
        iVar41 = iVar40 * iVar18;
        iVar43 = iVar40 * iVar20;
        fVar80 = pfVar3[iVar43 + -1 + iVar38];
        fVar84 = pfVar3[iVar41 + -1 + iVar39];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar41 + iVar42] - pfVar3[iVar43 + iVar42]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar43 + -1 + iVar39] -
                                                pfVar3[iVar41 + -1 + iVar38])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar40 * iVar19 + -1 + iVar38] -
                                                pfVar3[iVar40 * iVar19 + -1 + iVar39])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar43 + -1 + iVar39] -
                                                pfVar3[iVar41 + -1 + iVar38])));
        *pfVar55 = (fVar80 - fVar84) + auVar67._0_4_;
        *pfVar1 = auVar69._0_4_ - (fVar80 - fVar84);
      }
      pfVar55 = (float *)((long)pfVar47 + lVar63 + 0x10);
      pfVar1 = (float *)((long)pfVar65 + lVar63 + 0x10);
      auVar67 = vpbroadcastd_avx512vl();
      auVar67 = vpaddd_avx(auVar67,_DAT_005997a0);
      auVar67 = vcvtdq2ps_avx(auVar67);
      auVar15._4_4_ = fVar5;
      auVar15._0_4_ = fVar5;
      auVar15._8_4_ = fVar5;
      auVar15._12_4_ = fVar5;
      auVar16._4_4_ = fVar81;
      auVar16._0_4_ = fVar81;
      auVar16._8_4_ = fVar81;
      auVar16._12_4_ = fVar81;
      auVar69 = vfmadd132ps_fma(auVar67,auVar15,auVar16);
      auVar67 = vshufps_avx(auVar69,auVar69,0xff);
      uVar25 = vcmpps_avx512vl(auVar69,_DAT_00599190,0xd);
      bVar66 = (byte)(uVar25 >> 3);
      iVar39 = (int)((double)((ulong)(bVar66 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar66 & 1) * -0x4020000000000000) +
                    (double)auVar67._0_4_);
      if (((iVar30 < 1) || (iVar39 < 1)) ||
         ((iimage->height < iVar17 || (iVar40 = iVar2 + iVar39, iVar22 < iVar40)))) {
        haarXY(iimage,iVar30,iVar39,scale,pfVar55,pfVar1);
        iVar22 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar41 = iimage->data_width;
        iVar59 = iVar39 + -1 + scale;
        pfVar3 = iimage->data;
        iVar42 = iVar41 * iVar18;
        iVar43 = iVar41 * iVar20;
        fVar80 = pfVar3[iVar43 + -1 + iVar39];
        fVar84 = pfVar3[iVar42 + -1 + iVar40];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar42 + iVar59] - pfVar3[iVar43 + iVar59]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar43 + -1 + iVar40] -
                                                pfVar3[iVar42 + -1 + iVar39])));
        auVar71 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar41 * iVar19 + -1 + iVar39] -
                                                pfVar3[iVar41 * iVar19 + -1 + iVar40])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar43 + -1 + iVar40] -
                                                pfVar3[iVar42 + -1 + iVar39])));
        *pfVar55 = (fVar80 - fVar84) + auVar67._0_4_;
        *pfVar1 = auVar71._0_4_ - (fVar80 - fVar84);
      }
      auVar67 = vpermilpd_avx(auVar69,1);
      pfVar55 = (float *)((long)pfVar47 + lVar63 + 0x14);
      pfVar1 = (float *)((long)pfVar65 + lVar63 + 0x14);
      bVar66 = (byte)uVar25;
      iVar40 = (int)((double)((ulong)(bVar66 >> 2 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar66 >> 2 & 1) * -0x4020000000000000) +
                    (double)auVar67._0_4_);
      if (((iVar30 < 1) || (iVar40 < 1)) ||
         ((iimage->height < iVar17 || (iVar41 = iVar2 + iVar40, iVar22 < iVar41)))) {
        haarXY(iimage,iVar30,iVar40,scale,pfVar55,pfVar1);
        iVar22 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar58 = iVar40 + -1 + scale;
        iVar42 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar59 = iVar42 * iVar18;
        iVar43 = iVar42 * iVar20;
        fVar80 = pfVar3[iVar43 + -1 + iVar40];
        fVar84 = pfVar3[iVar59 + -1 + iVar41];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar59 + iVar58] - pfVar3[iVar43 + iVar58]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar43 + -1 + iVar41] -
                                                pfVar3[iVar59 + -1 + iVar40])));
        auVar71 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar42 * iVar19 + -1 + iVar40] -
                                                pfVar3[iVar42 * iVar19 + -1 + iVar41])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar43 + -1 + iVar41] -
                                                pfVar3[iVar59 + -1 + iVar40])));
        *pfVar55 = (fVar80 - fVar84) + auVar67._0_4_;
        *pfVar1 = auVar71._0_4_ - (fVar80 - fVar84);
      }
      auVar67 = vmovshdup_avx(auVar69);
      pfVar55 = (float *)((long)pfVar47 + lVar63 + 0x18);
      pfVar1 = (float *)((long)pfVar65 + lVar63 + 0x18);
      iVar41 = (int)((double)((ulong)(bVar66 >> 1 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar66 >> 1 & 1) * -0x4020000000000000) +
                    (double)auVar67._0_4_);
      if ((((iVar30 < 1) || (iVar41 < 1)) || (iimage->height < iVar17)) ||
         (iVar42 = iVar2 + iVar41, iVar22 < iVar42)) {
        haarXY(iimage,iVar30,iVar41,scale,pfVar55,pfVar1);
        iVar22 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar43 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar57 = iVar41 + -1 + scale;
        iVar58 = iVar43 * iVar18;
        iVar59 = iVar43 * iVar20;
        fVar80 = pfVar3[iVar59 + -1 + iVar41];
        fVar84 = pfVar3[iVar58 + -1 + iVar42];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar58 + iVar57] - pfVar3[iVar59 + iVar57]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar59 + -1 + iVar42] -
                                                pfVar3[iVar58 + -1 + iVar41])));
        auVar71 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar43 * iVar19 + -1 + iVar41] -
                                                pfVar3[iVar43 * iVar19 + -1 + iVar42])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar59 + -1 + iVar42] -
                                                pfVar3[iVar58 + -1 + iVar41])));
        *pfVar55 = (fVar80 - fVar84) + auVar67._0_4_;
        *pfVar1 = auVar71._0_4_ - (fVar80 - fVar84);
      }
      local_f8 = auVar69._0_4_;
      pfVar55 = (float *)((long)pfVar47 + lVar63 + 0x1c);
      pfVar1 = (float *)((long)pfVar65 + lVar63 + 0x1c);
      iVar42 = (int)((double)((ulong)(bVar66 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar66 & 1) * -0x4020000000000000) + (double)local_f8);
      if (((iVar30 < 1) || (iVar42 < 1)) ||
         ((iimage->height < iVar17 || (iVar43 = iVar2 + iVar42, iVar22 < iVar43)))) {
        haarXY(iimage,iVar30,iVar42,scale,pfVar55,pfVar1);
        iVar22 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar59 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar57 = iVar42 + -1 + scale;
        iVar58 = iVar59 * iVar18;
        iVar56 = iVar59 * iVar20;
        fVar80 = pfVar3[iVar56 + -1 + iVar42];
        fVar84 = pfVar3[iVar58 + -1 + iVar43];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar58 + iVar57] - pfVar3[iVar56 + iVar57]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar56 + -1 + iVar43] -
                                                pfVar3[iVar58 + -1 + iVar42])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar59 * iVar19 + -1 + iVar42] -
                                                pfVar3[iVar59 * iVar19 + -1 + iVar43])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar56 + -1 + iVar43] -
                                                pfVar3[iVar58 + -1 + iVar42])));
        *pfVar55 = (fVar80 - fVar84) + auVar67._0_4_;
        *pfVar1 = auVar69._0_4_ - (fVar80 - fVar84);
      }
      pfVar55 = (float *)((long)pfVar47 + lVar63 + 0x60);
      pfVar1 = (float *)((long)pfVar65 + lVar63 + 0x60);
      if (((iVar32 < 1) || (iVar54 < 1)) ||
         ((iimage->height < iVar21 || (iVar43 = iVar2 + iVar54, iVar22 < iVar43)))) {
        haarXY(iimage,iVar32,iVar54,scale,pfVar55,pfVar1);
        iVar22 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar58 = iVar54 + -1 + scale;
        iVar59 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar56 = iVar59 * iVar27;
        iVar57 = iVar59 * iVar28;
        fVar80 = pfVar3[iVar57 + -1 + iVar54];
        fVar84 = pfVar3[iVar56 + -1 + iVar43];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar56 + iVar58] - pfVar3[iVar57 + iVar58]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar57 + -1 + iVar43] -
                                                pfVar3[iVar56 + -1 + iVar54])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar59 * iVar23 + -1 + iVar54] -
                                                pfVar3[iVar59 * iVar23 + -1 + iVar43])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar57 + -1 + iVar43] -
                                                pfVar3[iVar56 + -1 + iVar54])));
        *pfVar55 = (fVar80 - fVar84) + auVar67._0_4_;
        *pfVar1 = auVar69._0_4_ - (fVar80 - fVar84);
      }
      pfVar55 = (float *)((long)pfVar47 + lVar63 + 100);
      pfVar1 = (float *)((long)pfVar65 + lVar63 + 100);
      if ((((iVar32 < 1) || (iVar36 < 1)) || (iimage->height < iVar21)) ||
         (iVar54 = iVar2 + iVar36, iVar22 < iVar54)) {
        haarXY(iimage,iVar32,iVar36,scale,pfVar55,pfVar1);
        iVar22 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar59 = iVar36 + -1 + scale;
        iVar43 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar57 = iVar43 * iVar27;
        iVar58 = iVar43 * iVar28;
        fVar80 = pfVar3[iVar58 + -1 + iVar36];
        fVar84 = pfVar3[iVar57 + -1 + iVar54];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar57 + iVar59] - pfVar3[iVar58 + iVar59]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar58 + -1 + iVar54] -
                                                pfVar3[iVar57 + -1 + iVar36])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar43 * iVar23 + -1 + iVar36] -
                                                pfVar3[iVar43 * iVar23 + -1 + iVar54])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar58 + -1 + iVar54] -
                                                pfVar3[iVar57 + -1 + iVar36])));
        *pfVar55 = (fVar80 - fVar84) + auVar67._0_4_;
        *pfVar1 = auVar69._0_4_ - (fVar80 - fVar84);
      }
      pfVar55 = (float *)((long)pfVar47 + lVar63 + 0x68);
      pfVar1 = (float *)((long)pfVar65 + lVar63 + 0x68);
      if (((iVar32 < 1) || (iVar37 < 1)) ||
         ((iimage->height < iVar21 || (iVar54 = iVar2 + iVar37, iVar22 < iVar54)))) {
        haarXY(iimage,iVar32,iVar37,scale,pfVar55,pfVar1);
        iVar22 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar43 = iVar37 + -1 + scale;
        iVar36 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar58 = iVar36 * iVar27;
        iVar59 = iVar36 * iVar28;
        fVar80 = pfVar3[iVar59 + -1 + iVar37];
        fVar84 = pfVar3[iVar58 + -1 + iVar54];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar58 + iVar43] - pfVar3[iVar59 + iVar43]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar59 + -1 + iVar54] -
                                                pfVar3[iVar58 + -1 + iVar37])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar36 * iVar23 + -1 + iVar37] -
                                                pfVar3[iVar36 * iVar23 + -1 + iVar54])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar59 + -1 + iVar54] -
                                                pfVar3[iVar58 + -1 + iVar37])));
        *pfVar55 = (fVar80 - fVar84) + auVar67._0_4_;
        *pfVar1 = auVar69._0_4_ - (fVar80 - fVar84);
      }
      pfVar55 = (float *)((long)pfVar47 + lVar63 + 0x6c);
      pfVar1 = (float *)((long)pfVar65 + lVar63 + 0x6c);
      if (((iVar32 < 1) || (iVar38 < 1)) ||
         ((iimage->height < iVar21 || (iVar54 = iVar2 + iVar38, iVar22 < iVar54)))) {
        haarXY(iimage,iVar32,iVar38,scale,pfVar55,pfVar1);
        iVar22 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar37 = iVar38 + -1 + scale;
        iVar36 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar59 = iVar36 * iVar27;
        iVar43 = iVar36 * iVar28;
        fVar80 = pfVar3[iVar43 + -1 + iVar38];
        fVar84 = pfVar3[iVar59 + -1 + iVar54];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar59 + iVar37] - pfVar3[iVar43 + iVar37]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar43 + -1 + iVar54] -
                                                pfVar3[iVar59 + -1 + iVar38])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar36 * iVar23 + -1 + iVar38] -
                                                pfVar3[iVar36 * iVar23 + -1 + iVar54])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar43 + -1 + iVar54] -
                                                pfVar3[iVar59 + -1 + iVar38])));
        *pfVar55 = (fVar80 - fVar84) + auVar67._0_4_;
        *pfVar1 = auVar69._0_4_ - (fVar80 - fVar84);
      }
      pfVar55 = (float *)((long)pfVar47 + lVar63 + 0x70);
      pfVar1 = (float *)((long)pfVar65 + lVar63 + 0x70);
      if ((((iVar32 < 1) || (iVar39 < 1)) || (iimage->height < iVar21)) ||
         (iVar54 = iVar2 + iVar39, iVar22 < iVar54)) {
        haarXY(iimage,iVar32,iVar39,scale,pfVar55,pfVar1);
        iVar22 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar37 = iVar39 + -1 + scale;
        iVar36 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar43 = iVar36 * iVar27;
        iVar38 = iVar36 * iVar28;
        fVar80 = pfVar3[iVar38 + -1 + iVar39];
        fVar84 = pfVar3[iVar43 + -1 + iVar54];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar43 + iVar37] - pfVar3[iVar38 + iVar37]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar38 + -1 + iVar54] -
                                                pfVar3[iVar43 + -1 + iVar39])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar36 * iVar23 + -1 + iVar39] -
                                                pfVar3[iVar36 * iVar23 + -1 + iVar54])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar38 + -1 + iVar54] -
                                                pfVar3[iVar43 + -1 + iVar39])));
        *pfVar55 = (fVar80 - fVar84) + auVar67._0_4_;
        *pfVar1 = auVar69._0_4_ - (fVar80 - fVar84);
      }
      pfVar55 = (float *)((long)pfVar47 + lVar63 + 0x74);
      pfVar1 = (float *)((long)pfVar65 + lVar63 + 0x74);
      if (((iVar32 < 1) || (iVar40 < 1)) ||
         ((iimage->height < iVar21 || (iVar54 = iVar2 + iVar40, iVar22 < iVar54)))) {
        haarXY(iimage,iVar32,iVar40,scale,pfVar55,pfVar1);
        iVar22 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar37 = iVar40 + -1 + scale;
        iVar36 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar39 = iVar36 * iVar27;
        iVar38 = iVar36 * iVar28;
        fVar80 = pfVar3[iVar38 + -1 + iVar40];
        fVar84 = pfVar3[iVar39 + -1 + iVar54];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar39 + iVar37] - pfVar3[iVar38 + iVar37]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar38 + -1 + iVar54] -
                                                pfVar3[iVar39 + -1 + iVar40])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar36 * iVar23 + -1 + iVar40] -
                                                pfVar3[iVar36 * iVar23 + -1 + iVar54])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar38 + -1 + iVar54] -
                                                pfVar3[iVar39 + -1 + iVar40])));
        *pfVar55 = (fVar80 - fVar84) + auVar67._0_4_;
        *pfVar1 = auVar69._0_4_ - (fVar80 - fVar84);
      }
      pfVar55 = (float *)((long)pfVar47 + lVar63 + 0x78);
      pfVar1 = (float *)((long)pfVar65 + lVar63 + 0x78);
      if (((iVar32 < 1) || (iVar41 < 1)) ||
         ((iimage->height < iVar21 || (iVar54 = iVar2 + iVar41, iVar22 < iVar54)))) {
        haarXY(iimage,iVar32,iVar41,scale,pfVar55,pfVar1);
        iVar22 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar37 = iVar41 + -1 + scale;
        iVar36 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar39 = iVar36 * iVar27;
        iVar38 = iVar36 * iVar28;
        fVar80 = pfVar3[iVar38 + -1 + iVar41];
        fVar84 = pfVar3[iVar39 + -1 + iVar54];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar39 + iVar37] - pfVar3[iVar38 + iVar37]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar38 + -1 + iVar54] -
                                                pfVar3[iVar39 + -1 + iVar41])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar36 * iVar23 + -1 + iVar41] -
                                                pfVar3[iVar36 * iVar23 + -1 + iVar54])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar38 + -1 + iVar54] -
                                                pfVar3[iVar39 + -1 + iVar41])));
        *pfVar55 = (fVar80 - fVar84) + auVar67._0_4_;
        *pfVar1 = auVar69._0_4_ - (fVar80 - fVar84);
      }
      pfVar55 = (float *)((long)pfVar47 + lVar63 + 0x7c);
      pfVar1 = (float *)((long)pfVar65 + lVar63 + 0x7c);
      if ((((iVar32 < 1) || (iVar42 < 1)) || (iimage->height < iVar21)) ||
         (iVar54 = iVar2 + iVar42, iVar22 < iVar54)) {
        haarXY(iimage,iVar32,iVar42,scale,pfVar55,pfVar1);
        pfVar47 = haarResponseX;
        pfVar65 = haarResponseY;
      }
      else {
        iVar22 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar36 = iVar42 + -1 + scale;
        iVar38 = iVar22 * iVar27;
        iVar37 = iVar22 * iVar28;
        fVar80 = pfVar3[iVar37 + -1 + iVar42];
        fVar84 = pfVar3[iVar38 + -1 + iVar54];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 + iVar36] - pfVar3[iVar37 + iVar36]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar37 + -1 + iVar54] -
                                                pfVar3[iVar38 + -1 + iVar42])));
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar22 * iVar23 + -1 + iVar42] -
                                                pfVar3[iVar22 * iVar23 + -1 + iVar54])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar37 + -1 + iVar54] -
                                                pfVar3[iVar38 + -1 + iVar42])));
        *pfVar55 = (fVar80 - fVar84) + auVar67._0_4_;
        *pfVar1 = auVar69._0_4_ - (fVar80 - fVar84);
      }
      auVar111 = ZEXT1664(auVar68);
      lVar63 = lVar63 + 0x20;
      bVar4 = iVar34 < 4;
      iVar34 = iVar34 + 8;
    } while (bVar4);
    lVar64 = lVar64 + 0xc0;
    bVar4 = (int)uVar24 < 10;
    uVar24 = uVar24 + 2;
  } while (bVar4);
LAB_001c0efc:
  fVar110 = auVar111._0_4_;
  auVar109._8_4_ = 0x3effffff;
  auVar109._0_8_ = 0x3effffff3effffff;
  auVar109._12_4_ = 0x3effffff;
  auVar108._8_4_ = 0x80000000;
  auVar108._0_8_ = 0x8000000080000000;
  auVar108._12_4_ = 0x80000000;
  auVar67 = vpternlogd_avx512vl(auVar109,ZEXT416((uint)(fVar110 * 0.5)),auVar108,0xf8);
  auVar67 = ZEXT416((uint)(fVar110 * 0.5 + auVar67._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  auVar68 = vpternlogd_avx512vl(auVar109,ZEXT416((uint)(fVar110 * 1.5)),auVar108,0xf8);
  auVar68 = ZEXT416((uint)(fVar110 * 1.5 + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar70 = vpternlogd_avx512vl(auVar109,ZEXT416((uint)(fVar110 * 2.5)),auVar108,0xf8);
  auVar70 = ZEXT416((uint)(fVar110 * 2.5 + auVar70._0_4_));
  auVar70 = vroundss_avx(auVar70,auVar70,0xb);
  auVar69 = vpternlogd_avx512vl(auVar109,ZEXT416((uint)(fVar110 * 3.5)),auVar108,0xf8);
  auVar69 = ZEXT416((uint)(fVar110 * 3.5 + auVar69._0_4_));
  auVar69 = vroundss_avx(auVar69,auVar69,0xb);
  auVar71 = vpternlogd_avx512vl(auVar109,ZEXT416((uint)(fVar110 * 4.5)),auVar108,0xf8);
  auVar71 = ZEXT416((uint)(fVar110 * 4.5 + auVar71._0_4_));
  auVar71 = vroundss_avx(auVar71,auVar71,0xb);
  auVar72 = vpternlogd_avx512vl(auVar109,ZEXT416((uint)(fVar110 * 5.5)),auVar108,0xf8);
  auVar72 = ZEXT416((uint)(fVar110 * 5.5 + auVar72._0_4_));
  auVar72 = vroundss_avx(auVar72,auVar72,0xb);
  auVar73 = vpternlogd_avx512vl(auVar109,ZEXT416((uint)(fVar110 * 6.5)),auVar108,0xf8);
  auVar73 = ZEXT416((uint)(fVar110 * 6.5 + auVar73._0_4_));
  auVar73 = vroundss_avx(auVar73,auVar73,0xb);
  auVar74 = vpternlogd_avx512vl(auVar109,ZEXT416((uint)(fVar110 * 7.5)),auVar108,0xf8);
  auVar74 = ZEXT416((uint)(auVar74._0_4_ + fVar110 * 7.5));
  auVar74 = vroundss_avx(auVar74,auVar74,0xb);
  auVar75 = vpternlogd_avx512vl(auVar109,ZEXT416((uint)(fVar110 * 8.5)),auVar108,0xf8);
  auVar75 = ZEXT416((uint)(fVar110 * 8.5 + auVar75._0_4_));
  auVar75 = vroundss_avx(auVar75,auVar75,0xb);
  auVar76 = vpternlogd_avx512vl(auVar109,ZEXT416((uint)(fVar110 * 9.5)),auVar108,0xf8);
  auVar76 = ZEXT416((uint)(fVar110 * 9.5 + auVar76._0_4_));
  auVar76 = vroundss_avx(auVar76,auVar76,0xb);
  auVar77 = vpternlogd_avx512vl(auVar109,ZEXT416((uint)(fVar110 * 10.5)),auVar108,0xf8);
  auVar77 = ZEXT416((uint)(fVar110 * 10.5 + auVar77._0_4_));
  auVar77 = vroundss_avx(auVar77,auVar77,0xb);
  auVar78 = vpternlogd_avx512vl(auVar109,ZEXT416((uint)(fVar110 * 11.5)),auVar108,0xf8);
  fVar87 = auVar70._0_4_;
  fVar81 = fVar87 + auVar68._0_4_;
  fVar5 = fVar87 + auVar67._0_4_;
  auVar70 = ZEXT416((uint)(fVar110 * 11.5 + auVar78._0_4_));
  auVar70 = vroundss_avx(auVar70,auVar70,0xb);
  fVar110 = fVar87 - auVar67._0_4_;
  fVar80 = fVar87 - auVar68._0_4_;
  fVar84 = fVar87 - auVar69._0_4_;
  fVar90 = fVar87 - auVar71._0_4_;
  fVar102 = fVar87 - auVar72._0_4_;
  fVar87 = fVar87 - auVar73._0_4_;
  fVar105 = auVar74._0_4_;
  fVar6 = fVar105 - auVar69._0_4_;
  fVar7 = fVar105 - auVar71._0_4_;
  fVar8 = fVar105 - auVar72._0_4_;
  fVar9 = fVar105 - auVar73._0_4_;
  fVar10 = fVar105 - auVar75._0_4_;
  fVar11 = fVar105 - auVar76._0_4_;
  fVar12 = fVar105 - auVar77._0_4_;
  fVar105 = fVar105 - auVar70._0_4_;
  gauss_s1_c0[0] = expf(fVar81 * fVar81 * fVar79);
  gauss_s1_c0[1] = expf(fVar5 * fVar5 * fVar79);
  gauss_s1_c0[2] = expf(fVar110 * fVar110 * fVar79);
  gauss_s1_c0[3] = expf(fVar80 * fVar80 * fVar79);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar84 * fVar84 * fVar79);
  gauss_s1_c0[6] = expf(fVar90 * fVar90 * fVar79);
  gauss_s1_c0[7] = expf(fVar102 * fVar102 * fVar79);
  gauss_s1_c0[8] = expf(fVar87 * fVar87 * fVar79);
  gauss_s1_c1[0] = expf(fVar6 * fVar6 * fVar79);
  gauss_s1_c1[1] = expf(fVar7 * fVar7 * fVar79);
  gauss_s1_c1[2] = expf(fVar8 * fVar8 * fVar79);
  gauss_s1_c1[3] = expf(fVar9 * fVar9 * fVar79);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar10 * fVar10 * fVar79);
  gauss_s1_c1[6] = expf(fVar11 * fVar11 * fVar79);
  gauss_s1_c1[7] = expf(fVar12 * fVar12 * fVar79);
  gauss_s1_c1[8] = expf(fVar105 * fVar105 * fVar79);
  auVar86._8_4_ = 0x7fffffff;
  auVar86._0_8_ = 0x7fffffff7fffffff;
  auVar86._12_4_ = 0x7fffffff;
  uVar25 = 0xfffffff8;
  fVar81 = 0.0;
  lVar64 = 0;
  lVar63 = 0;
  local_f8 = 0.0;
  do {
    pfVar47 = gauss_s1_c1;
    uVar24 = (uint)uVar25;
    if (uVar24 != 7) {
      pfVar47 = gauss_s1_c0;
    }
    lVar60 = (long)(int)local_f8;
    lVar63 = (long)(int)lVar63;
    if (uVar24 == 0xfffffff8) {
      pfVar47 = gauss_s1_c1;
    }
    uVar53 = 0;
    local_f8 = (float)((int)local_f8 + 4);
    uVar44 = 0xfffffff8;
    lVar49 = (long)haarResponseX + lVar64;
    lVar31 = (long)haarResponseY + lVar64;
    do {
      pfVar65 = gauss_s1_c1;
      if (uVar44 != 7) {
        pfVar65 = gauss_s1_c0;
      }
      auVar106 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar44 == 0xfffffff8) {
        pfVar65 = gauss_s1_c1;
      }
      uVar26 = (ulong)(uVar44 >> 0x1c & 0xfffffff8);
      uVar29 = uVar53;
      lVar33 = lVar31;
      lVar61 = lVar49;
      do {
        lVar50 = 0;
        pfVar55 = (float *)((long)pfVar47 + (ulong)(uint)((int)(uVar25 >> 0x1f) << 5));
        do {
          fVar5 = pfVar65[uVar26] * *pfVar55;
          pfVar55 = pfVar55 + (ulong)(~uVar24 >> 0x1f) * 2 + -1;
          auVar67 = vinsertps_avx(ZEXT416(*(uint *)(lVar33 + lVar50 * 4)),
                                  ZEXT416(*(uint *)(lVar61 + lVar50 * 4)),0x10);
          lVar50 = lVar50 + 1;
          auVar99._0_4_ = fVar5 * auVar67._0_4_;
          auVar99._4_4_ = fVar5 * auVar67._4_4_;
          auVar99._8_4_ = fVar5 * auVar67._8_4_;
          auVar99._12_4_ = fVar5 * auVar67._12_4_;
          auVar67 = vandps_avx(auVar99,auVar86);
          auVar67 = vmovlhps_avx(auVar99,auVar67);
          auVar89._0_4_ = auVar106._0_4_ + auVar67._0_4_;
          auVar89._4_4_ = auVar106._4_4_ + auVar67._4_4_;
          auVar89._8_4_ = auVar106._8_4_ + auVar67._8_4_;
          auVar89._12_4_ = auVar106._12_4_ + auVar67._12_4_;
          auVar106 = ZEXT1664(auVar89);
        } while (lVar50 != 9);
        uVar29 = uVar29 + 0x18;
        uVar26 = uVar26 + (ulong)(-1 < (int)uVar44) * 2 + -1;
        lVar61 = lVar61 + 0x60;
        lVar33 = lVar33 + 0x60;
      } while (uVar29 < uVar44 * 0x18 + 0x198);
      uVar44 = uVar44 + 5;
      uVar53 = uVar53 + 0x78;
      fVar5 = gauss_s2_arr[lVar60];
      auVar14._4_4_ = fVar5;
      auVar14._0_4_ = fVar5;
      auVar14._8_4_ = fVar5;
      auVar14._12_4_ = fVar5;
      auVar69 = vmulps_avx512vl(auVar89,auVar14);
      lVar60 = lVar60 + 1;
      auVar92._0_4_ = auVar69._0_4_ * auVar69._0_4_;
      auVar92._4_4_ = auVar69._4_4_ * auVar69._4_4_;
      auVar92._8_4_ = auVar69._8_4_ * auVar69._8_4_;
      auVar92._12_4_ = auVar69._12_4_ * auVar69._12_4_;
      auVar68 = vshufpd_avx(auVar69,auVar69,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar63) = auVar69;
      lVar63 = lVar63 + 4;
      lVar49 = lVar49 + 0x1e0;
      lVar31 = lVar31 + 0x1e0;
      auVar67 = vmovshdup_avx(auVar92);
      auVar70 = vfmadd231ss_fma(auVar67,auVar69,auVar69);
      auVar67 = vshufps_avx(auVar69,auVar69,0xff);
      auVar68 = vfmadd213ss_fma(auVar68,auVar68,auVar70);
      auVar67 = vfmadd213ss_fma(auVar67,auVar67,auVar68);
      fVar81 = fVar81 + auVar67._0_4_;
    } while (local_f8 != (float)(int)lVar60);
    lVar64 = lVar64 + 0x14;
    uVar25 = (ulong)(uVar24 + 5);
  } while ((int)uVar24 < 3);
  if (fVar81 < 0.0) {
    fVar81 = sqrtf(fVar81);
  }
  else {
    auVar67 = vsqrtss_avx(ZEXT416((uint)fVar81),ZEXT416((uint)fVar81));
    fVar81 = auVar67._0_4_;
  }
  lVar64 = 0;
  auVar106 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar81)));
  do {
    auVar111 = vmulps_avx512f(auVar106,*(undefined1 (*) [64])(ipoint->descriptor + lVar64));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar64) = auVar111;
    lVar64 = lVar64 + 0x10;
  } while (lVar64 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_8_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=8, k_count+=8) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                float ipoint_x_sub_int_scale_add_k6_mul_scale = ipoint_x_sub_int_scale + k6 * scale;
                float ipoint_x_sub_int_scale_add_k7_mul_scale = ipoint_x_sub_int_scale + k7 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_k6_mul_scale + (ipoint_x_sub_int_scale_add_k6_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_k7_mul_scale + (ipoint_x_sub_int_scale_add_k7_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=8, k_count+=8) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_05 + k6 * scale);
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_05 + k7 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}